

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O0

char * __thiscall
sisl::body_centered_cubic<char>::operator()
          (body_centered_cubic<char> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint *local_70;
  uint *local_58;
  int az;
  int ay;
  int ax;
  int _z;
  int _y;
  int _x;
  __va_list_tag *vl_local;
  int d0_local;
  body_centered_cubic<char> *this_local;
  
  uVar1 = vl->gp_offset;
  if (uVar1 < 0x29) {
    local_58 = (uint *)((long)(int)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    local_58 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = local_58 + 2;
  }
  uVar1 = *local_58;
  uVar2 = vl->gp_offset;
  if (uVar2 < 0x29) {
    local_70 = (uint *)((long)(int)uVar2 + (long)vl->reg_save_area);
    vl->gp_offset = uVar2 + 8;
  }
  else {
    local_70 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = local_70 + 2;
  }
  iVar3 = (*(this->super_base_lattice<char>)._vptr_base_lattice[1])
                    (this,(ulong)(uint)d0,(ulong)uVar1,(ulong)*local_70);
  return (char *)CONCAT44(extraout_var,iVar3);
}

Assistant:

virtual const T& operator()(int d0, va_list vl) const {
            int _x = d0, _y = 0, _z = 0;
            int ax, ay, az;

            _y = va_arg(vl, int);
            _z = va_arg(vl, int);

            return this->operator()(_x, _y, _z);
        }